

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lossfactorstocsv.cpp
# Opt level: O0

void lossfactorstocsv::DoIt(void)

{
  size_t sVar1;
  float local_24;
  uint local_20;
  int counter;
  amplification_factor af;
  event_count ec;
  size_t i;
  
  ReadOpts();
  fprintf(_stdout,"event_id,amplification_id,factor\n");
  do {
    sVar1 = fread(&af,8,1,_stdin);
    if (sVar1 == 0) {
      return;
    }
    for (local_24 = 0.0; local_24 != af.factor; local_24 = (float)((int)local_24 + 1)) {
      sVar1 = fread(&local_20,8,1,_stdin);
      if (sVar1 == 0) {
        fprintf(_stderr,"FATAL: Incomplete data for Event ID = %d\n",
                (ulong)(uint)af.amplification_id);
        exit(1);
      }
      fprintf(_stdout,"%d,%d,%f\n",(double)(float)counter,(ulong)(uint)af.amplification_id,
              (ulong)local_20);
    }
  } while( true );
}

Assistant:

void DoIt() {

    size_t i = ReadOpts();

    event_count ec;
    amplification_factor af;

    fprintf(stdout, "event_id,amplification_id,factor\n");   // Header

    while (i = fread(&ec, sizeof(ec), 1, stdin) != 0) {

      for (int counter = 0; counter != ec.count; ++counter) {

        i = fread(&af, sizeof(af), 1, stdin);
	if (i == 0) {
	  fprintf(stderr, "FATAL: Incomplete data for Event ID = %d\n",
		  ec.event_id);
	  exit(EXIT_FAILURE);
	}

	fprintf(stdout, "%d,%d,%f\n", ec.event_id, af.amplification_id,
		af.factor);

      }

    }

  }